

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessPanId
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined1 *puVar10;
  _Alloc_hider _Var11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar12;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  uint32_t channelMask;
  uint16_t panId;
  CommissionerAppPtr commissioner;
  string local_278;
  string *local_258;
  string *local_250;
  uint local_248;
  ushort local_242;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  undefined1 local_230 [8];
  char local_228 [16];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  format_string_checker<char> local_1f8;
  CommissionerAppPtr local_1c8;
  ErrorCode local_1b8;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  ErrorCode local_190;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  ErrorCode local_168;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  ErrorCode local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  Error local_118;
  ErrorCode local_f0 [2];
  long local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Error local_c8;
  Error local_a0;
  Error local_78;
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_1c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_1c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            (&local_78,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_1c8);
  local_240._0_4_ = local_78.mCode;
  local_238._M_p = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_78.mMessage._M_dataplus._M_p,
             local_78.mMessage._M_dataplus._M_p + local_78.mMessage._M_string_length);
  local_258 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_210 = 0;
  local_208._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_240._0_4_;
  local_218._M_p = (pointer)&local_208;
  std::__cxx11::string::operator=(local_258,(string *)&local_238);
  local_250 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_218);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != &local_208) {
    operator_delete(local_218._M_p);
  }
  if (local_238._M_p != local_228) {
    operator_delete(local_238._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.mMessage._M_dataplus._M_p != &local_78.mMessage.field_2) {
    operator_delete(local_78.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_00128fe2;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_1f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_1f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_1f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_1f8.parse_funcs_[0] = (parse_func)0x0;
    pcVar9 = "too few arguments";
    local_1f8.context_.types_ = local_1f8.types_;
    do {
      pcVar7 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",&local_1f8);
      }
      pcVar9 = pcVar7;
    } while (pcVar7 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_1f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_278,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_140 = kInvalidArgs;
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_240._0_4_ = local_140;
    local_238._M_p = local_228;
    std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_138,local_138 + local_130);
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_240._0_4_;
    local_218._M_p = (pointer)&local_208;
    std::__cxx11::string::operator=(local_258,(string *)&local_238);
    std::__cxx11::string::operator=(local_250,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p != &local_208) {
      operator_delete(local_218._M_p);
    }
    if (local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    if (local_138 != local_128) {
      operator_delete(local_138);
    }
    paVar6 = &local_278.field_2;
LAB_001286e9:
    _Var11._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             **)(paVar6->_M_local_buf + -0x10);
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"query","");
    utils::ToLower((string *)local_240,pbVar2 + 1);
    utils::ToLower((string *)&local_1f8,&local_278);
    if (local_238._M_p ==
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_238._M_p == (char *)0x0) {
        bVar12 = true;
      }
      else {
        iVar4 = bcmp((void *)CONCAT44(local_240._4_4_,local_240._0_4_),(void *)local_1f8._0_8_,
                     (size_t)local_238._M_p);
        bVar12 = iVar4 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    puVar3 = &local_1f8.context_.super_basic_format_parse_context<char>.format_str_.size_;
    if ((undefined8 *)local_1f8._0_8_ != puVar3) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_) != local_230) {
      operator_delete((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (bVar12) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x80 < (ulong)((long)(aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
        utils::ParseInteger<unsigned_int>(&local_a0,&local_248,pbVar2 + 2);
        local_240._0_4_ = local_a0.mCode;
        local_238._M_p = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_a0.mMessage._M_dataplus._M_p,
                   local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_240._0_4_;
        local_218._M_p = (pointer)&local_208;
        std::__cxx11::string::operator=(local_258,(string *)&local_238);
        std::__cxx11::string::operator=(local_250,(string *)&local_218);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &local_208) {
          operator_delete(local_218._M_p);
        }
        if (local_238._M_p != local_228) {
          operator_delete(local_238._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
          operator_delete(local_a0.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00128fe2;
        utils::ParseInteger<unsigned_short>
                  (&local_c8,&local_242,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3);
        local_240._0_4_ = local_c8.mCode;
        local_238._M_p = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_c8.mMessage._M_dataplus._M_p,
                   local_c8.mMessage._M_dataplus._M_p + local_c8.mMessage._M_string_length);
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_240._0_4_;
        local_218._M_p = (pointer)&local_208;
        std::__cxx11::string::operator=(local_258,(string *)&local_238);
        std::__cxx11::string::operator=(local_250,(string *)&local_218);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &local_208) {
          operator_delete(local_218._M_p);
        }
        if (local_238._M_p != local_228) {
          operator_delete(local_238._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.mMessage._M_dataplus._M_p != &local_c8.mMessage.field_2) {
          operator_delete(local_c8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00128fe2;
        (*((local_1c8.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x46])
                  (local_f0,local_1c8.
                            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)local_248,(ulong)local_242,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
        local_240._0_4_ = local_f0[0];
        local_238._M_p = local_228;
        std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_e8,local_e0 + local_e8)
        ;
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        local_218._M_p = (pointer)&local_208;
        Value::operator=(__return_storage_ptr__,(Value *)local_240);
        Value::~Value((Value *)local_240);
        paVar6 = &local_d8;
        goto LAB_001286e9;
      }
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
      local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_1f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_1f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_1f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_1f8.parse_funcs_[0] = (parse_func)0x0;
      pcVar9 = "too few arguments";
      local_1f8.context_.types_ = local_1f8.types_;
      do {
        pcVar7 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",&local_1f8);
        }
        pcVar9 = pcVar7;
      } while (pcVar7 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_1f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_278,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      local_168 = kInvalidArgs;
      puVar8 = local_150;
      local_160 = puVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_278._M_dataplus._M_p,
                 local_278._M_dataplus._M_p + local_278._M_string_length);
      local_240._0_4_ = local_168;
      local_238._M_p = local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_160,local_160 + local_158);
      local_210 = 0;
      local_208._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_240._0_4_;
      local_218._M_p = (pointer)&local_208;
      std::__cxx11::string::operator=(local_258,(string *)&local_238);
      std::__cxx11::string::operator=(local_250,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != &local_208) {
        operator_delete(local_218._M_p);
      }
      puVar10 = local_160;
      if (local_238._M_p != local_228) {
        operator_delete(local_238._M_p);
        puVar10 = local_160;
      }
    }
    else {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"conflict","");
      utils::ToLower((string *)local_240,pbVar2 + 1);
      utils::ToLower((string *)&local_1f8,&local_278);
      if (local_238._M_p ==
          local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_238._M_p == (char *)0x0) {
          bVar12 = true;
        }
        else {
          iVar4 = bcmp((void *)CONCAT44(local_240._4_4_,local_240._0_4_),(void *)local_1f8._0_8_,
                       (size_t)local_238._M_p);
          bVar12 = iVar4 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((undefined8 *)local_1f8._0_8_ != puVar3) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if ((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_) != local_230) {
        operator_delete((undefined1 *)CONCAT44(local_240._4_4_,local_240._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (bVar12) {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (0x40 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
          utils::ParseInteger<unsigned_short>(&local_118,(unsigned_short *)&local_248,pbVar2 + 2);
          local_240._0_4_ = local_118.mCode;
          local_238._M_p = local_228;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_118.mMessage._M_dataplus._M_p,
                     local_118.mMessage._M_dataplus._M_p + local_118.mMessage._M_string_length);
          local_210 = 0;
          local_208._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_240._0_4_;
          local_218._M_p = (pointer)&local_208;
          std::__cxx11::string::operator=(local_258,(string *)&local_238);
          std::__cxx11::string::operator=(local_250,(string *)&local_218);
          EVar1 = (__return_storage_ptr__->mError).mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_p != &local_208) {
            operator_delete(local_218._M_p);
          }
          if (local_238._M_p != local_228) {
            operator_delete(local_238._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.mMessage._M_dataplus._M_p != &local_118.mMessage.field_2) {
            operator_delete(local_118.mMessage._M_dataplus._M_p);
          }
          if (EVar1 != kNone) goto LAB_00128fe2;
          uVar5 = (*((local_1c8.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x47])
                            (local_1c8.
                             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(ulong)(ushort)local_248);
          std::__cxx11::to_string(&local_50,uVar5 & 0xff);
          Value::Value((Value *)local_240,&local_50);
          Value::operator=(__return_storage_ptr__,(Value *)local_240);
          Value::~Value((Value *)local_240);
          paVar6 = &local_50.field_2;
          goto LAB_001286e9;
        }
        local_1f8._0_8_ = (ulong)(uint)local_1f8._4_4_ << 0x20;
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "too few arguments";
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
        local_1f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_1f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_1f8.parse_funcs_[0] = (parse_func)0x0;
        pcVar9 = "too few arguments";
        local_1f8.context_.types_ = local_1f8.types_;
        do {
          pcVar7 = pcVar9 + 1;
          if (*pcVar9 == '}') {
            if ((pcVar7 == "") || (*pcVar7 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar7 = pcVar9 + 2;
          }
          else if (*pcVar9 == '{') {
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar9,"",&local_1f8);
          }
          pcVar9 = pcVar7;
        } while (pcVar7 != "");
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)&local_1f8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_278,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
        local_190 = kInvalidArgs;
        puVar8 = local_178;
        local_188 = puVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        local_240._0_4_ = local_190;
        local_238._M_p = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_188,local_188 + local_180);
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_240._0_4_;
        local_218._M_p = (pointer)&local_208;
        std::__cxx11::string::operator=(local_258,(string *)&local_238);
        std::__cxx11::string::operator=(local_250,(string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &local_208) {
          operator_delete(local_218._M_p);
        }
        puVar10 = local_188;
        if (local_238._M_p != local_228) {
          operator_delete(local_238._M_p);
          puVar10 = local_188;
        }
      }
      else {
        local_1f8.types_[0] = string_type;
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "\'{}\' is not a valid sub-command";
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
        local_1f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_1f8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_1f8.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar9 = "\'{}\' is not a valid sub-command";
        local_1f8.context_.types_ = local_1f8.types_;
        do {
          pcVar7 = pcVar9 + 1;
          if (*pcVar9 == '}') {
            if ((pcVar7 == "") || (*pcVar7 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar7 = pcVar9 + 2;
          }
          else if (*pcVar9 == '{') {
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar9,"",&local_1f8);
          }
          pcVar9 = pcVar7;
        } while (pcVar7 != "");
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1f8._0_8_ = pbVar2[1]._M_dataplus._M_p;
        local_1f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)pbVar2[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_1f8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_278,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
        local_1b8 = kInvalidCommand;
        puVar8 = local_1a0;
        local_1b0 = puVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        local_240._0_4_ = local_1b8;
        local_238._M_p = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_1b0,local_1b0 + local_1a8);
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_240._0_4_;
        local_218._M_p = (pointer)&local_208;
        std::__cxx11::string::operator=(local_258,(string *)&local_238);
        std::__cxx11::string::operator=(local_250,(string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &local_208) {
          operator_delete(local_218._M_p);
        }
        puVar10 = local_1b0;
        if (local_238._M_p != local_228) {
          operator_delete(local_238._M_p);
          puVar10 = local_1b0;
        }
      }
    }
    if (puVar10 != puVar8) {
      operator_delete(puVar10);
    }
    paVar6 = &local_278.field_2;
    _Var11._M_p = local_278._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var11._M_p != paVar6) {
    operator_delete(_Var11._M_p);
  }
LAB_00128fe2:
  if (local_1c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessPanId(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        uint32_t channelMask;
        uint16_t panId;
        VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(panId, aExpr[3]));
        SuccessOrExit(value = commissioner->PanIdQuery(channelMask, panId, aExpr[4]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "conflict"))
    {
        uint16_t panId;
        bool     conflict;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(panId, aExpr[2]));
        conflict = commissioner->HasPanIdConflict(panId);
        value    = std::to_string(conflict);
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}